

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

xformDatabase * initXformDB(void)

{
  void *pvVar1;
  int local_24;
  int i;
  matrix4 *mp;
  xformDatabase *xdb;
  
  xdb = (xformDatabase *)malloc(0xb8);
  if (xdb == (xformDatabase *)0x0) {
    warn("could not create transformation database");
    xdb = (xformDatabase *)0x0;
  }
  else {
    pvVar1 = malloc(0x400);
    if (pvVar1 == (void *)0x0) {
      warn("could not create transformation stack");
      if (xdb != (xformDatabase *)0x0) {
        free(xdb);
      }
      xdb = (xformDatabase *)0x0;
    }
    else {
      xdb->last = (transformData *)0x0;
      xdb->xforms = (transformData *)0x0;
      xdb->nlevs = 0;
      for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
        xdb->level[local_24] = (transformData *)0x0;
      }
      xdb->nstack = 0;
      for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
        xdb->ctmstack[local_24] = (matrix4 *)((long)pvVar1 + (long)local_24 * 0x80);
      }
      initializeXFStack(xdb);
      xdb->glast = (goToRec *)0x0;
      xdb->golist = (goToRec *)0x0;
      xdb->sortedByRes = (xformAtomRecords **)0x0;
    }
  }
  return xdb;
}

Assistant:

xformDatabase* initXformDB() {
   xformDatabase *xdb = NULL;
   matrix4 *mp = NULL;
   int i = 0;

   xdb = (xformDatabase *)malloc(sizeof(xformDatabase));
   if (!xdb) {
      warn("could not create transformation database");
      return NULL;
   }

   mp = (matrix4*)malloc(sizeof(matrix4)*MAX_XFORM_STACK_DEPTH);
   if (!mp) {
      warn("could not create transformation stack");
      if (xdb) { free(xdb); }
      return NULL;
   }

   xdb->xforms = xdb->last = NULL;

   xdb->nlevs = 0;
   for(i = 0; i < MAX_XFORM_LEVELS; i++) {
      xdb->level[i] = NULL;
   }

   xdb->nstack = 0;
   for(i = 0; i < MAX_XFORM_STACK_DEPTH; i++) {
      xdb->ctmstack[i] = &(mp[i]);
   }
   initializeXFStack(xdb);

   xdb->golist = xdb->glast = NULL;

   xdb->sortedByRes = NULL;

   return xdb;
}